

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::printOpenHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  size_t sVar2;
  Colour colourGuard;
  char local_21;
  
  poVar1 = (ostream *)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam00000000001b9060 = 0x2d2d2d2d2d2d2d;
    uRam00000000001b9067._0_1_ = '-';
    uRam00000000001b9067._1_1_ = '-';
    uRam00000000001b9067._2_1_ = '-';
    uRam00000000001b9067._3_1_ = '-';
    uRam00000000001b9067._4_1_ = '-';
    uRam00000000001b9067._5_1_ = '-';
    uRam00000000001b9067._6_1_ = '-';
    uRam00000000001b9067._7_1_ = '-';
    DAT_001b9050 = '-';
    DAT_001b9050_1._0_1_ = '-';
    DAT_001b9050_1._1_1_ = '-';
    DAT_001b9050_1._2_1_ = '-';
    DAT_001b9050_1._3_1_ = '-';
    DAT_001b9050_1._4_1_ = '-';
    DAT_001b9050_1._5_1_ = '-';
    DAT_001b9050_1._6_1_ = '-';
    uRam00000000001b9058 = 0x2d2d2d2d2d2d2d;
    DAT_001b905f = 0x2d;
    DAT_001b9040 = '-';
    DAT_001b9040_1._0_1_ = '-';
    DAT_001b9040_1._1_1_ = '-';
    DAT_001b9040_1._2_1_ = '-';
    DAT_001b9040_1._3_1_ = '-';
    DAT_001b9040_1._4_1_ = '-';
    DAT_001b9040_1._5_1_ = '-';
    DAT_001b9040_1._6_1_ = '-';
    uRam00000000001b9048._0_1_ = '-';
    uRam00000000001b9048._1_1_ = '-';
    uRam00000000001b9048._2_1_ = '-';
    uRam00000000001b9048._3_1_ = '-';
    uRam00000000001b9048._4_1_ = '-';
    uRam00000000001b9048._5_1_ = '-';
    uRam00000000001b9048._6_1_ = '-';
    uRam00000000001b9048._7_1_ = '-';
    DAT_001b9030 = '-';
    DAT_001b9030_1._0_1_ = '-';
    DAT_001b9030_1._1_1_ = '-';
    DAT_001b9030_1._2_1_ = '-';
    DAT_001b9030_1._3_1_ = '-';
    DAT_001b9030_1._4_1_ = '-';
    DAT_001b9030_1._5_1_ = '-';
    DAT_001b9030_1._6_1_ = '-';
    uRam00000000001b9038._0_1_ = '-';
    uRam00000000001b9038._1_1_ = '-';
    uRam00000000001b9038._2_1_ = '-';
    uRam00000000001b9038._3_1_ = '-';
    uRam00000000001b9038._4_1_ = '-';
    uRam00000000001b9038._5_1_ = '-';
    uRam00000000001b9038._6_1_ = '-';
    uRam00000000001b9038._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam00000000001b9028._0_1_ = '-';
    uRam00000000001b9028._1_1_ = '-';
    uRam00000000001b9028._2_1_ = '-';
    uRam00000000001b9028._3_1_ = '-';
    uRam00000000001b9028._4_1_ = '-';
    uRam00000000001b9028._5_1_ = '-';
    uRam00000000001b9028._6_1_ = '-';
    uRam00000000001b9028._7_1_ = '-';
    DAT_001b906f = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)45>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)45>()::line,sVar2)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_21,1);
  Colour::use(Headers);
  printHeaderString(this,_name,0);
  Colour::use(None);
  return;
}

Assistant:

void ConsoleReporter::printOpenHeader(std::string const& _name) {
    stream << getLineOfChars<'-'>() << '\n';
    {
        Colour colourGuard(Colour::Headers);
        printHeaderString(_name);
    }
}